

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

idx_t duckdb::UpdateValidityStatistics
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  sel_t *psVar1;
  bool bVar2;
  idx_t i;
  idx_t iVar3;
  idx_t row_idx;
  
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    bVar2 = BaseStatistics::CanHaveNull(&stats->statistics);
    if (!bVar2) {
      iVar3 = 0;
      do {
        if (count == iVar3) goto LAB_0052a390;
        psVar1 = update->sel->sel_vector;
        row_idx = iVar3;
        if (psVar1 != (sel_t *)0x0) {
          row_idx = (idx_t)psVar1[iVar3];
        }
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(update->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        iVar3 = iVar3 + 1;
      } while (bVar2);
      (stats->statistics).has_null = true;
    }
  }
LAB_0052a390:
  ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)&sel->selection_data
            );
  sel->sel_vector = (sel_t *)0x0;
  return count;
}

Assistant:

idx_t UpdateValidityStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                               idx_t count, SelectionVector &sel) {
	auto &mask = update.validity;
	auto &validity = stats.statistics;
	if (!mask.AllValid() && !validity.CanHaveNull()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (!mask.RowIsValid(idx)) {
				validity.SetHasNullFast();
				break;
			}
		}
	}
	sel.Initialize(nullptr);
	return count;
}